

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_HmacSha256DataEmpty_Test::CryptoUtil_HmacSha256DataEmpty_Test
          (CryptoUtil_HmacSha256DataEmpty_Test *this)

{
  CryptoUtil_HmacSha256DataEmpty_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CryptoUtil_HmacSha256DataEmpty_Test_009dd240;
  return;
}

Assistant:

TEST(CryptoUtil, HmacSha256DataEmpty) {
  try {
    ByteData key(
        "616975656F616975656F616975656F616975656F616975656F616975656F6169");
    ByteData data;
    ByteData256 byte_data = CryptoUtil::HmacSha256(key.GetBytes(), data);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "HmacSha256 error.");
    return;
  }
  ASSERT_TRUE(false);
}